

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

Animation * __thiscall
rlottie::internal::model::Property<VPointF,_void>::animation(Property<VPointF,_void> *this)

{
  details in_RAX;
  details local_18;
  
  if (this->isValue_ == true) {
    local_18 = in_RAX;
    destroy(this);
    std::make_unique<rlottie::internal::model::KeyFrames<VPointF,void>>();
    this->impl_ = local_18;
    local_18 = (details)0x0;
    std::
    unique_ptr<rlottie::internal::model::KeyFrames<VPointF,_void>,_std::default_delete<rlottie::internal::model::KeyFrames<VPointF,_void>_>_>
    ::~unique_ptr(&local_18.animation_);
    this->isValue_ = false;
  }
  return (Animation *)this->impl_;
}

Assistant:

Animation &animation()
    {
        if (isValue_) {
            destroy();
            construct(impl_.animation_, std::make_unique<Animation>());
            isValue_ = false;
        }
        return *(impl_.animation_.get());
    }